

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cc
# Opt level: O1

void brotli::StoreCommands
               (uint8_t *literals,size_t num_literals,uint32_t *commands,size_t num_commands,
               size_t *storage_ix,uint8_t *storage)

{
  undefined1 uVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  size_t i;
  long lVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint8_t cmd_depths [128];
  uint8_t cmd_depth [64];
  uint16_t cmd_bits [128];
  uint8_t lit_depths [256];
  uint32_t cmd_histo [128];
  uint16_t cmd_bits_1 [64];
  uint16_t lit_bits [256];
  uint32_t lit_histo [256];
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  uint8_t local_df8 [64];
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 local_da0;
  undefined8 local_d98;
  undefined8 local_d90;
  undefined8 local_d88;
  undefined8 local_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  uint16_t local_cf8 [64];
  byte local_c78 [256];
  undefined8 local_b78 [8];
  undefined8 local_b38;
  undefined8 local_af8 [8];
  undefined8 local_ab8;
  undefined1 auStack_a78 [128];
  undefined8 local_9f8;
  undefined1 auStack_9b8 [256];
  uint32_t local_8b8 [64];
  uint32_t local_7b8 [20];
  int local_768;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  uint16_t local_638 [256];
  uint32_t local_438 [258];
  ulong uVar12;
  
  memset(local_c78,0,0x100);
  memset(local_638,0,0x200);
  memset(local_438,0,0x400);
  if (num_literals != 0) {
    sVar6 = 0;
    do {
      local_438[literals[sVar6]] = local_438[literals[sVar6]] + 1;
      sVar6 = sVar6 + 1;
    } while (num_literals != sVar6);
  }
  BuildAndStoreHuffmanTreeFast(local_438,num_literals,8,local_c78,local_638,storage_ix,storage);
  local_df8[0x30] = '\0';
  local_df8[0x31] = '\0';
  local_df8[0x32] = '\0';
  local_df8[0x33] = '\0';
  local_df8[0x34] = '\0';
  local_df8[0x35] = '\0';
  local_df8[0x36] = '\0';
  local_df8[0x37] = '\0';
  local_df8[0x38] = '\0';
  local_df8[0x39] = '\0';
  local_df8[0x3a] = '\0';
  local_df8[0x3b] = '\0';
  local_df8[0x3c] = '\0';
  local_df8[0x3d] = '\0';
  local_df8[0x3e] = '\0';
  local_df8[0x3f] = '\0';
  local_df8[0x20] = '\0';
  local_df8[0x21] = '\0';
  local_df8[0x22] = '\0';
  local_df8[0x23] = '\0';
  local_df8[0x24] = '\0';
  local_df8[0x25] = '\0';
  local_df8[0x26] = '\0';
  local_df8[0x27] = '\0';
  local_df8[0x28] = '\0';
  local_df8[0x29] = '\0';
  local_df8[0x2a] = '\0';
  local_df8[0x2b] = '\0';
  local_df8[0x2c] = '\0';
  local_df8[0x2d] = '\0';
  local_df8[0x2e] = '\0';
  local_df8[0x2f] = '\0';
  local_df8[0x10] = '\0';
  local_df8[0x11] = '\0';
  local_df8[0x12] = '\0';
  local_df8[0x13] = '\0';
  local_df8[0x14] = '\0';
  local_df8[0x15] = '\0';
  local_df8[0x16] = '\0';
  local_df8[0x17] = '\0';
  local_df8[0x18] = '\0';
  local_df8[0x19] = '\0';
  local_df8[0x1a] = '\0';
  local_df8[0x1b] = '\0';
  local_df8[0x1c] = '\0';
  local_df8[0x1d] = '\0';
  local_df8[0x1e] = '\0';
  local_df8[0x1f] = '\0';
  local_df8[0] = '\0';
  local_df8[1] = '\0';
  local_df8[2] = '\0';
  local_df8[3] = '\0';
  local_df8[4] = '\0';
  local_df8[5] = '\0';
  local_df8[6] = '\0';
  local_df8[7] = '\0';
  local_df8[8] = '\0';
  local_df8[9] = '\0';
  local_df8[10] = '\0';
  local_df8[0xb] = '\0';
  local_df8[0xc] = '\0';
  local_df8[0xd] = '\0';
  local_df8[0xe] = '\0';
  local_df8[0xf] = '\0';
  local_e08 = 0;
  uStack_e00 = 0;
  local_e18 = 0;
  uStack_e10 = 0;
  local_e28 = 0;
  uStack_e20 = 0;
  local_e38 = 0;
  uStack_e30 = 0;
  memset(&local_d78,0,0x100);
  memset(local_8b8,0,0x200);
  if (num_commands != 0) {
    sVar6 = 0;
    do {
      local_8b8[(byte)commands[sVar6]] = local_8b8[(byte)commands[sVar6]] + 1;
      sVar6 = sVar6 + 1;
    } while (num_commands != sVar6);
  }
  local_8b8[1] = local_8b8[1] + 1;
  local_8b8[2] = local_8b8[2] + 1;
  local_7b8[0] = local_7b8[0] + 1;
  local_768 = local_768 + 1;
  CreateHuffmanTree(local_8b8,0x40,0xf,(uint8_t *)&local_e38);
  CreateHuffmanTree(local_7b8,0x40,0xe,local_df8);
  local_db8 = uStack_e20;
  uStack_db0 = local_e18;
  local_da8 = uStack_e10;
  local_da0 = local_e38;
  local_d98 = local_e08;
  local_d90 = uStack_e30;
  local_d88 = uStack_e00;
  local_d80 = local_e28;
  ConvertBitDepthsToSymbols((uint8_t *)&local_db8,0x40,(uint16_t *)&local_6b8);
  local_d78 = local_688;
  uStack_d70 = uStack_680;
  local_d68 = local_668;
  uStack_d60 = uStack_660;
  local_d58 = local_648;
  uStack_d50 = uStack_640;
  local_d48 = local_6b8;
  uStack_d40 = uStack_6b0;
  local_d38 = local_6a8;
  uStack_d30 = uStack_6a0;
  local_d28 = local_698;
  uStack_d20 = uStack_690;
  local_d18 = local_678;
  uStack_d10 = uStack_670;
  local_d08 = local_658;
  uStack_d00 = uStack_650;
  ConvertBitDepthsToSymbols(local_df8,0x40,local_cf8);
  lVar8 = 0;
  memset(local_b78,0,0x2c0);
  local_b78[0] = uStack_e20;
  local_b38 = local_e18;
  local_af8[0] = uStack_e10;
  local_ab8 = local_e08;
  local_9f8 = uStack_e00;
  do {
    uVar1 = *(undefined1 *)((long)&uStack_e30 + lVar8);
    *(undefined1 *)(local_af8 + lVar8) = *(undefined1 *)((long)&local_e38 + lVar8);
    auStack_a78[lVar8 * 8] = uVar1;
    auStack_9b8[lVar8 * 8] = *(undefined1 *)((long)&local_e28 + lVar8);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  StoreHuffmanTree((uint8_t *)local_b78,0x2c0,storage_ix,storage);
  StoreHuffmanTree(local_df8,0x40,storage_ix,storage);
  if (num_commands != 0) {
    sVar6 = 0;
    do {
      uVar11 = commands[sVar6] & 0xff;
      uVar12 = (ulong)uVar11;
      bVar2 = *(byte *)((long)&local_e38 + uVar12);
      uVar3 = *(ushort *)((long)&local_d78 + uVar12 * 2);
      if (uVar3 >> (bVar2 & 0x3f) != 0) {
LAB_0017fcb4:
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/./write_bits.h"
                      ,0x2c,
                      "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                     );
      }
      if (0x38 < bVar2) {
LAB_0017fcd3:
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/./write_bits.h"
                      ,0x2d,
                      "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                     );
      }
      uVar9 = commands[sVar6] >> 8;
      uVar5 = *storage_ix;
      uVar7 = bVar2 + uVar5;
      *(ulong *)(storage + (uVar5 >> 3)) =
           (ulong)uVar3 << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
      *storage_ix = uVar7;
      uVar4 = StoreCommands::kNumExtraBits[uVar12];
      if (uVar9 >> ((byte)uVar4 & 0x3f) != 0) goto LAB_0017fcb4;
      *(ulong *)(storage + (uVar7 >> 3)) =
           (ulong)uVar9 << ((byte)uVar7 & 7) | (ulong)storage[uVar7 >> 3];
      *storage_ix = uVar4 + uVar7;
      if (uVar11 < 0x18) {
        for (iVar10 = uVar9 + StoreCommands::kInsertOffset[uVar12]; iVar10 != 0;
            iVar10 = iVar10 + -1) {
          bVar2 = local_c78[*literals];
          if (local_638[*literals] >> (bVar2 & 0x3f) != 0) goto LAB_0017fcb4;
          if (0x38 < bVar2) goto LAB_0017fcd3;
          uVar12 = *storage_ix;
          *(ulong *)(storage + (uVar12 >> 3)) =
               (ulong)local_638[*literals] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
          *storage_ix = bVar2 + uVar12;
          literals = literals + 1;
        }
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != num_commands);
  }
  return;
}

Assistant:

void StoreCommands(const uint8_t* literals, const size_t num_literals,
                   const uint32_t* commands, const size_t num_commands,
                   size_t* storage_ix, uint8_t* storage) {
  uint8_t lit_depths[256] = { 0 };
  uint16_t lit_bits[256] = { 0 };
  uint32_t lit_histo[256] = { 0 };
  for (size_t i = 0; i < num_literals; ++i) {
    ++lit_histo[literals[i]];
  }
  BuildAndStoreHuffmanTreeFast(lit_histo, num_literals,
                               /* max_bits = */ 8,
                               lit_depths, lit_bits,
                               storage_ix, storage);

  uint8_t cmd_depths[128] = { 0 };
  uint16_t cmd_bits[128] = { 0 };
  uint32_t cmd_histo[128] = { 0 };
  for (size_t i = 0; i < num_commands; ++i) {
    ++cmd_histo[commands[i] & 0xff];
  }
  cmd_histo[1] += 1;
  cmd_histo[2] += 1;
  cmd_histo[64] += 1;
  cmd_histo[84] += 1;
  BuildAndStoreCommandPrefixCode(cmd_histo, cmd_depths, cmd_bits,
                                 storage_ix, storage);

  static const uint32_t kNumExtraBits[128] = {
    0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 12, 14, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8, 8,
    9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
    17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22, 23, 23, 24, 24,
  };
  static const uint32_t kInsertOffset[24] = {
    0, 1, 2, 3, 4, 5, 6, 8, 10, 14, 18, 26, 34, 50, 66, 98, 130, 194, 322, 578,
    1090, 2114, 6210, 22594,
  };

  for (size_t i = 0; i < num_commands; ++i) {
    const uint32_t cmd = commands[i];
    const uint32_t code = cmd & 0xff;
    const uint32_t extra = cmd >> 8;
    WriteBits(cmd_depths[code], cmd_bits[code], storage_ix, storage);
    WriteBits(kNumExtraBits[code], extra, storage_ix, storage);
    if (code < 24) {
      const uint32_t insert = kInsertOffset[code] + extra;
      for (uint32_t j = 0; j < insert; ++j) {
        const uint8_t lit = *literals;
        WriteBits(lit_depths[lit], lit_bits[lit], storage_ix, storage);
        ++literals;
      }
    }
  }
}